

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorNinePatch.cpp
# Opt level: O3

SharedPtr<Decorator> __thiscall
Rml::DecoratorNinePatchInstancer::InstanceDecorator
          (DecoratorNinePatchInstancer *this,String *param_1,PropertyDictionary *properties,
          DecoratorInstancerInterface *instancer_interface)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Spritesheet *pSVar2;
  byte bVar3;
  DecoratorNinePatchInstancer *pDVar4;
  byte bVar5;
  Property *pPVar6;
  NumericValue NVar7;
  Sprite *_rect_outer;
  Sprite *_rect_inner;
  RenderManager *render_manager;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  int i;
  long lVar9;
  DecoratorInstancerInterface *in_R8;
  Array<NumericValue,_4> *_edges;
  bool bVar10;
  Texture _texture;
  SharedPtr<Decorator> SVar11;
  String sprite_name;
  Array<NumericValue,_4> edges;
  undefined1 local_91;
  DecoratorNinePatchInstancer *local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  DecoratorNinePatch *local_60;
  Array<NumericValue,_4> local_58;
  
  local_58._M_elems[2].number = 0.0;
  local_58._M_elems[2].unit = UNKNOWN;
  local_58._M_elems[3].number = 0.0;
  local_58._M_elems[3].unit = UNKNOWN;
  local_58._M_elems[0].number = 0.0;
  local_58._M_elems[0].unit = UNKNOWN;
  local_58._M_elems[1].number = 0.0;
  local_58._M_elems[1].unit = UNKNOWN;
  lVar9 = 0;
  bVar5 = 0;
  local_90 = this;
  do {
    bVar3 = bVar5;
    pPVar6 = PropertyDictionary::GetProperty
                       ((PropertyDictionary *)instancer_interface,
                        param_1[3].field_2._M_local_buf[lVar9 + 10]);
    NVar7 = Property::GetNumericValue(pPVar6);
    local_58._M_elems[lVar9] = NVar7;
    bVar10 = ((ulong)NVar7 & 0x7fffffff) != 0;
    lVar9 = lVar9 + 1;
    bVar5 = bVar3 | bVar10;
  } while (lVar9 != 4);
  pPVar6 = PropertyDictionary::GetProperty
                     ((PropertyDictionary *)instancer_interface,param_1[3].field_2._M_local_buf[8]);
  Property::Get<std::__cxx11::string>(&local_88,pPVar6);
  _rect_outer = DecoratorInstancerInterface::GetSprite(in_R8,&local_88);
  if (_rect_outer == (Sprite *)0x0) {
    Log::Message(LT_WARNING,"Could not find sprite named \'%s\' in ninepatch decorator.");
    (local_90->super_DecoratorInstancer)._vptr_DecoratorInstancer = (_func_int **)0x0;
    (local_90->super_DecoratorInstancer).super_EffectSpecification.properties.properties.
    super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    _Var8._M_pi = extraout_RDX_00;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p == &local_88.field_2) goto LAB_0020de80;
  }
  else {
    paVar1 = &local_88.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != paVar1) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    pPVar6 = PropertyDictionary::GetProperty
                       ((PropertyDictionary *)instancer_interface,param_1[3].field_2._M_local_buf[9]
                       );
    Property::Get<std::__cxx11::string>(&local_88,pPVar6);
    _rect_inner = DecoratorInstancerInterface::GetSprite(in_R8,&local_88);
    if (_rect_inner != (Sprite *)0x0) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != paVar1) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      if (_rect_outer->sprite_sheet == _rect_inner->sprite_sheet) {
        local_88._M_dataplus._M_p = (pointer)0x0;
        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<Rml::DecoratorNinePatch,std::allocator<Rml::DecoratorNinePatch>>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_88._M_string_length,
                   (DecoratorNinePatch **)&local_88,(allocator<Rml::DecoratorNinePatch> *)&local_91)
        ;
        local_60 = (DecoratorNinePatch *)local_88._M_dataplus._M_p;
        _edges = &local_58;
        if (!(bool)(bVar3 | bVar10)) {
          _edges = (Array<NumericValue,_4> *)0x0;
        }
        pSVar2 = _rect_outer->sprite_sheet;
        render_manager = DecoratorInstancerInterface::GetRenderManager(in_R8);
        _texture = TextureSource::GetTexture(&pSVar2->texture_source,render_manager);
        bVar10 = DecoratorNinePatch::Initialise
                           (local_60,&_rect_outer->rectangle,&_rect_inner->rectangle,_edges,_texture
                            ,_rect_outer->sprite_sheet->display_scale);
        pDVar4 = local_90;
        _Var8._M_pi = extraout_RDX_03;
        if (!bVar10) {
          (local_90->super_DecoratorInstancer)._vptr_DecoratorInstancer = (_func_int **)0x0;
          (local_90->super_DecoratorInstancer).super_EffectSpecification.properties.properties.
          super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_90 = pDVar4;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              CONCAT44(local_88._M_string_length._4_4_,(undefined4)local_88._M_string_length) !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       CONCAT44(local_88._M_string_length._4_4_,
                                (undefined4)local_88._M_string_length));
            _Var8._M_pi = extraout_RDX_04;
            local_90 = pDVar4;
          }
          goto LAB_0020de80;
        }
      }
      else {
        Log::Message(LT_WARNING,
                     "The outer and inner sprites in a ninepatch decorator must be from the same sprite sheet."
                    );
        local_88._M_dataplus._M_p._0_4_ = 0;
        local_88._M_dataplus._M_p._4_4_ = 0;
        local_88._M_string_length._0_4_ = 0;
        local_88._M_string_length._4_4_ = 0;
        _Var8._M_pi = extraout_RDX;
      }
      *(undefined4 *)&(local_90->super_DecoratorInstancer)._vptr_DecoratorInstancer =
           local_88._M_dataplus._M_p._0_4_;
      *(undefined4 *)((long)&(local_90->super_DecoratorInstancer)._vptr_DecoratorInstancer + 4) =
           local_88._M_dataplus._M_p._4_4_;
      *(undefined4 *)
       &(local_90->super_DecoratorInstancer).super_EffectSpecification.properties.properties.
        super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (undefined4)local_88._M_string_length;
      *(undefined4 *)
       ((long)&(local_90->super_DecoratorInstancer).super_EffectSpecification.properties.properties.
               super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
               ._M_impl.super__Vector_impl_data + 4) = local_88._M_string_length._4_4_;
      goto LAB_0020de80;
    }
    Log::Message(LT_WARNING,"Could not find sprite named \'%s\' in ninepatch decorator.");
    (local_90->super_DecoratorInstancer)._vptr_DecoratorInstancer = (_func_int **)0x0;
    (local_90->super_DecoratorInstancer).super_EffectSpecification.properties.properties.
    super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    _Var8._M_pi = extraout_RDX_01;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p == paVar1) goto LAB_0020de80;
  }
  pDVar4 = local_90;
  operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  _Var8._M_pi = extraout_RDX_02;
  local_90 = pDVar4;
LAB_0020de80:
  SVar11.super___shared_ptr<Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var8._M_pi;
  SVar11.super___shared_ptr<Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_90;
  return (SharedPtr<Decorator>)SVar11.super___shared_ptr<Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

SharedPtr<Decorator> DecoratorNinePatchInstancer::InstanceDecorator(const String& /*name*/, const PropertyDictionary& properties,
	const DecoratorInstancerInterface& instancer_interface)
{
	bool edges_set = false;
	Array<NumericValue, 4> edges;
	for (int i = 0; i < 4; i++)
	{
		edges[i] = properties.GetProperty(edge_ids[i])->GetNumericValue();
		if (edges[i].number != 0.0f)
		{
			edges_set = true;
		}
	}

	const Sprite* sprite_outer = nullptr;
	const Sprite* sprite_inner = nullptr;

	{
		const String sprite_name = properties.GetProperty(sprite_outer_id)->Get<String>();
		sprite_outer = instancer_interface.GetSprite(sprite_name);
		if (!sprite_outer)
		{
			Log::Message(Log::LT_WARNING, "Could not find sprite named '%s' in ninepatch decorator.", sprite_name.c_str());
			return nullptr;
		}
	}
	{
		const String sprite_name = properties.GetProperty(sprite_inner_id)->Get<String>();
		sprite_inner = instancer_interface.GetSprite(sprite_name);
		if (!sprite_inner)
		{
			Log::Message(Log::LT_WARNING, "Could not find sprite named '%s' in ninepatch decorator.", sprite_name.c_str());
			return nullptr;
		}
	}

	if (sprite_outer->sprite_sheet != sprite_inner->sprite_sheet)
	{
		Log::Message(Log::LT_WARNING, "The outer and inner sprites in a ninepatch decorator must be from the same sprite sheet.");
		return nullptr;
	}

	auto decorator = MakeShared<DecoratorNinePatch>();

	if (!decorator->Initialise(sprite_outer->rectangle, sprite_inner->rectangle, (edges_set ? &edges : nullptr),
			sprite_outer->sprite_sheet->texture_source.GetTexture(instancer_interface.GetRenderManager()), sprite_outer->sprite_sheet->display_scale))
	{
		return nullptr;
	}

	return decorator;
}